

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

InliningMode __thiscall wasm::anon_unknown_18::Inlining::getInliningMode(Inlining *this,Name name)

{
  Name name_00;
  bool bVar1;
  InliningMode IVar2;
  Function *pFVar3;
  mapped_type *this_00;
  PassOptions *options;
  pointer this_01;
  mapped_type *info;
  Function *func;
  Inlining *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  pFVar3 = Module::getFunction(this->module,name);
  this_00 = std::
            unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
            ::operator[](&this->infos,(key_type *)&this_local);
  if (this_00->inliningMode == Unknown) {
    if ((pFVar3->noFullInline & 1U) == 0) {
      options = Pass::getPassOptions(&this->super_Pass);
      bVar1 = FunctionInfo::worthFullInlining(this_00,options);
      if (bVar1) {
        this_00->inliningMode = Full;
        return Full;
      }
    }
    if (((pFVar3->noPartialInline & 1U) == 0) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->functionSplitter), bVar1
       )) {
      this_01 = std::
                unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ::operator->(&this->functionSplitter);
      name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)this_local;
      pFVar3 = Module::getFunction(this->module,name_00);
      IVar2 = FunctionSplitter::getSplitDrivenInliningMode(this_01,pFVar3,this_00);
      this_00->inliningMode = IVar2;
      name_local.super_IString.str._M_str._4_4_ = this_00->inliningMode;
    }
    else {
      this_00->inliningMode = Uninlineable;
      name_local.super_IString.str._M_str._4_4_ = this_00->inliningMode;
    }
  }
  else {
    name_local.super_IString.str._M_str._4_4_ = this_00->inliningMode;
  }
  return name_local.super_IString.str._M_str._4_4_;
}

Assistant:

InliningMode getInliningMode(Name name) {
    auto* func = module->getFunction(name);
    auto& info = infos[name];

    if (info.inliningMode != InliningMode::Unknown) {
      return info.inliningMode;
    }

    // Check if the function itself is worth inlining as it is.
    if (!func->noFullInline && info.worthFullInlining(getPassOptions())) {
      return info.inliningMode = InliningMode::Full;
    }

    // Otherwise, check if we can at least inline part of it, if we are
    // interested in such things.
    if (!func->noPartialInline && functionSplitter) {
      info.inliningMode = functionSplitter->getSplitDrivenInliningMode(
        module->getFunction(name), info);
      return info.inliningMode;
    }

    // Cannot be fully or partially inlined => uninlineable.
    info.inliningMode = InliningMode::Uninlineable;
    return info.inliningMode;
  }